

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int acttab_insert(acttab *p,int makeItSafe)

{
  int iVar1;
  lookahead_action *plVar2;
  int iVar3;
  lookahead_action *plVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",0x2aa,
                  "int acttab_insert(acttab *, int)");
  }
  iVar9 = p->nActionAlloc;
  iVar3 = p->nsymbol + p->nAction + 1;
  iVar6 = iVar9;
  if (iVar9 <= iVar3) {
    iVar6 = iVar3 + iVar9 + 0x14;
    p->nActionAlloc = iVar6;
    plVar4 = (lookahead_action *)realloc(p->aAction,(long)iVar6 << 3);
    p->aAction = plVar4;
    if (plVar4 == (lookahead_action *)0x0) {
      fwrite("malloc failed\n",0xe,1,_stderr);
      exit(1);
    }
    iVar6 = p->nActionAlloc;
    for (lVar11 = (long)iVar9; lVar11 < iVar6; lVar11 = lVar11 + 1) {
      plVar4[lVar11].lookahead = -1;
      plVar4[lVar11].action = -1;
    }
  }
  uVar7 = 0;
  if (makeItSafe == 0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (long)p->mnLookahead;
  }
  uVar10 = p->nAction;
  if (0 < (int)uVar10) {
    uVar7 = (ulong)uVar10;
  }
  uVar5 = (ulong)(int)uVar10;
  iVar9 = -uVar10;
LAB_001025d3:
  do {
    iVar9 = iVar9 + 1;
    if ((long)uVar5 <= lVar11) {
      uVar13 = 0;
      if (makeItSafe != 0) {
        uVar13 = p->mnLookahead;
      }
      uVar16 = (long)iVar6 - (long)p->mxLookahead;
      uVar14 = (ulong)(int)uVar13;
      uVar12 = uVar16 & 0xffffffff;
      if ((int)uVar16 < (int)uVar13) {
        uVar12 = (ulong)uVar13;
      }
      uVar13 = ~uVar13;
      break;
    }
    uVar5 = uVar5 - 1;
    plVar4 = p->aAction;
    iVar3 = plVar4[uVar5].lookahead;
    if ((iVar3 == p->mnLookahead) && (plVar4[uVar5].action == p->mnAction)) {
      uVar13 = p->nLookahead;
      uVar14 = 0;
      if (0 < (int)uVar13) {
        uVar14 = (ulong)uVar13;
      }
      uVar16 = 0;
      while (uVar14 != uVar16) {
        iVar1 = p->aLookahead[uVar16].lookahead;
        uVar15 = (iVar1 - iVar3) + (int)uVar5;
        if (((((int)uVar15 < 0) || ((int)uVar10 <= (int)uVar15)) ||
            (iVar1 != plVar4[uVar15].lookahead)) ||
           (plVar2 = p->aLookahead + uVar16, uVar16 = uVar16 + 1,
           plVar2->action != plVar4[uVar15].action)) goto LAB_001025d3;
      }
      uVar15 = 0;
      for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
        uVar15 = uVar15 + (iVar3 + iVar9 + (int)uVar14 == plVar4[uVar14].lookahead &&
                          -1 < plVar4[uVar14].lookahead);
      }
      if (uVar15 == uVar13) goto LAB_00102737;
    }
  } while( true );
LAB_001026bc:
  uVar5 = uVar12;
  if ((long)uVar14 < (long)uVar16) {
    plVar4 = p->aAction;
    if (plVar4[uVar14].lookahead < 0) {
      uVar15 = p->nLookahead;
      if (p->nLookahead < 1) {
        uVar15 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar15 == uVar5) {
          uVar5 = 0;
          goto LAB_00102708;
        }
        uVar8 = (p->aLookahead[uVar5].lookahead - p->mnLookahead) + (int)uVar14;
      } while ((-1 < (int)uVar8) && (uVar5 = uVar5 + 1, plVar4[uVar8].lookahead < 0));
    }
    goto LAB_001026cc;
  }
  goto LAB_00102737;
  while( true ) {
    iVar9 = (int)(uVar5 + 1);
    plVar2 = plVar4 + uVar5;
    uVar5 = uVar5 + 1;
    if (iVar9 + p->mnLookahead + uVar13 == plVar2->lookahead) break;
LAB_00102708:
    uVar15 = (uint)uVar7;
    if (uVar7 == uVar5) goto LAB_0010272d;
  }
  uVar15 = iVar9 - 1;
LAB_0010272d:
  uVar5 = uVar14;
  if (uVar15 == uVar10) goto LAB_00102737;
LAB_001026cc:
  uVar14 = uVar14 + 1;
  uVar13 = uVar13 - 1;
  goto LAB_001026bc;
LAB_00102737:
  for (lVar11 = 0; iVar9 = (int)uVar5, lVar11 < p->nLookahead; lVar11 = lVar11 + 1) {
    iVar9 = (p->aLookahead[lVar11].lookahead - p->mnLookahead) + iVar9;
    p->aAction[iVar9] = p->aLookahead[lVar11];
    uVar10 = p->nAction;
    if ((int)uVar10 <= iVar9) {
      uVar10 = iVar9 + 1;
      p->nAction = uVar10;
    }
  }
  if ((makeItSafe != 0) && (iVar6 = p->nterminal + iVar9, (int)uVar10 <= iVar6)) {
    p->nAction = iVar6 + 1;
  }
  p->nLookahead = 0;
  return iVar9 - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p, int makeItSafe){
  int i, j, k, n, end;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->nsymbol + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  end = makeItSafe ? p->mnLookahead : 0;
  for(i=p->nAction-1; i>=end; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<end ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    i = makeItSafe ? p->mnLookahead : 0;
    for(; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
#if 0
  printf("Acttab:");
  for(j=0; j<p->nLookahead; j++){
    printf(" %d", p->aLookahead[j].lookahead);
  }
  printf(" inserted at %d\n", i);
#endif
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  if( makeItSafe && i+p->nterminal>=p->nAction ) p->nAction = i+p->nterminal+1;
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}